

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O1

int __thiscall ON_Polyline::Clean(ON_Polyline *this,double tolerance)

{
  double *pdVar1;
  int iVar2;
  ON_3dPoint *pOVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  
  iVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
  if (2 < iVar2) {
    iVar4 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
    if (iVar4 < 3) {
      uVar7 = (ulong)(iVar4 - 1);
      iVar9 = 0;
    }
    else {
      iVar9 = 0;
      lVar10 = 1;
      lVar8 = 0x18;
      do {
        pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
        dVar11 = ON_3dPoint::DistanceTo(pOVar3 + iVar9,(ON_3dPoint *)((long)&pOVar3->x + lVar8));
        if (tolerance < dVar11) {
          iVar9 = iVar9 + 1;
          lVar6 = (long)iVar9;
          if (lVar6 < lVar10) {
            pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
            pOVar3[lVar6].z = *(double *)((long)&pOVar3->z + lVar8);
            pdVar1 = (double *)((long)&pOVar3->x + lVar8);
            dVar11 = pdVar1[1];
            pOVar3[lVar6].x = *pdVar1;
            pOVar3[lVar6].y = dVar11;
          }
        }
        lVar10 = lVar10 + 1;
        iVar4 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
        uVar7 = (long)iVar4 - 1;
        lVar8 = lVar8 + 0x18;
      } while (lVar10 < (long)uVar7);
    }
    if (iVar9 + 2 < iVar4) {
      pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
      pOVar3[(long)iVar9 + 1].z = pOVar3[(int)uVar7].z;
      dVar11 = pOVar3[(int)uVar7].y;
      pOVar3[(long)iVar9 + 1].x = pOVar3[(int)uVar7].x;
      pOVar3[(long)iVar9 + 1].y = dVar11;
      (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count = iVar9 + 2;
    }
    uVar5 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
    if (2 < (int)uVar5) {
      do {
        pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
        dVar11 = ON_3dPoint::DistanceTo(pOVar3 + ((ulong)uVar5 - 2),pOVar3 + ((ulong)uVar5 - 1));
        if (tolerance < dVar11) break;
        pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
        lVar8 = (long)(this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
        pOVar3[lVar8 + -2].z = pOVar3[lVar8 + -1].z;
        dVar11 = pOVar3[lVar8 + -1].y;
        pOVar3[lVar8 + -2].x = pOVar3[lVar8 + -1].x;
        pOVar3[lVar8 + -2].y = dVar11;
        iVar4 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
        uVar5 = iVar4 - 1;
        (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count = uVar5;
      } while (3 < iVar4);
    }
  }
  return iVar2 - (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
}

Assistant:

int ON_Polyline::Clean( double tolerance )
{
  // 14 January 2005 Dale Lear
  //     Fixed this cleaner so that it did not modify
  //     the start and end point.
  int count0 = m_count;

  if ( m_count > 2 )
  {
    int i,j;
    j = 0;
    for ( i = 1; i < m_count-1; i++ )
    {
       if ( m_a[j].DistanceTo(m_a[i]) <= tolerance )
         continue;
       j++;
       if ( i > j )
         m_a[j] = m_a[i];
    }

    if ( m_count > j+2 )
    {
      m_a[j+1] = m_a[m_count-1];
      m_count = j+2;
    }

    while ( m_count > 2 && m_a[m_count-2].DistanceTo(m_a[m_count-1]) <= tolerance )
    {
      m_a[m_count-2] = m_a[m_count-1];
      m_count--;
    }
  }

  return count0-m_count;
}